

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

Vec_Int_t * Saig_ManCbaReason2Inputs(Saig_ManCba_t *p,Vec_Int_t *vReasons)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iInput;
  int Entry;
  int i;
  Vec_Int_t *vVisited;
  Vec_Int_t *vOriginal;
  Vec_Int_t *vReasons_local;
  Saig_ManCba_t *p_local;
  
  iVar1 = Saig_ManPiNum(p->pAig);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Saig_ManPiNum(p->pAig);
  p_01 = Vec_IntStart(iVar1);
  iInput = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vReasons);
    if (iVar1 <= iInput) {
      Vec_IntFree(p_01);
      return p_00;
    }
    iVar1 = Vec_IntEntry(vReasons,iInput);
    iVar1 = Vec_IntEntry(p->vMapPiF2A,iVar1 << 1);
    if ((iVar1 < p->nInputs) || (iVar2 = Aig_ManCiNum(p->pAig), iVar2 <= iVar1)) break;
    iVar2 = Vec_IntEntry(p_01,iVar1);
    if (iVar2 == 0) {
      Vec_IntPush(p_00,iVar1 - p->nInputs);
    }
    Vec_IntAddToEntry(p_01,iVar1,1);
    iInput = iInput + 1;
  }
  __assert_fail("iInput >= p->nInputs && iInput < Aig_ManCiNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                ,0xcc,"Vec_Int_t *Saig_ManCbaReason2Inputs(Saig_ManCba_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Saig_ManCbaReason2Inputs( Saig_ManCba_t * p, Vec_Int_t * vReasons )
{
    Vec_Int_t * vOriginal, * vVisited;
    int i, Entry;
    vOriginal = Vec_IntAlloc( Saig_ManPiNum(p->pAig) ); 
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        assert( iInput >= p->nInputs && iInput < Aig_ManCiNum(p->pAig) );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            Vec_IntPush( vOriginal, iInput - p->nInputs );
        Vec_IntAddToEntry( vVisited, iInput, 1 );
    }
    Vec_IntFree( vVisited );
    return vOriginal;
}